

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit_action.cc
# Opt level: O0

void re2c::emit_accept_binary
               (OutputFile *o,uint32_t ind,bool *readCh,State *s,accept_t *accepts,size_t l,size_t r
               )

{
  ulong n;
  OutputFile *pOVar1;
  opt_t *poVar2;
  State **ppSVar3;
  char *local_58;
  size_t m;
  size_t l_local;
  accept_t *accepts_local;
  State *s_local;
  bool *readCh_local;
  uint32_t ind_local;
  OutputFile *o_local;
  
  if (l < r) {
    n = l + r >> 1;
    pOVar1 = OutputFile::wind(o,ind);
    pOVar1 = OutputFile::ws(pOVar1,"if (");
    poVar2 = Opt::operator->((Opt *)&opts);
    pOVar1 = OutputFile::wstring(pOVar1,&poVar2->yyaccept);
    if (r == l + 1) {
      local_58 = " == ";
    }
    else {
      local_58 = " <= ";
    }
    pOVar1 = OutputFile::ws(pOVar1,local_58);
    pOVar1 = OutputFile::wu64(pOVar1,n);
    OutputFile::ws(pOVar1,") {\n");
    emit_accept_binary(o,ind + 1,readCh,s,accepts,l,n);
    pOVar1 = OutputFile::wind(o,ind);
    OutputFile::ws(pOVar1,"} else {\n");
    emit_accept_binary(o,ind + 1,readCh,s,accepts,n + 1,r);
    pOVar1 = OutputFile::wind(o,ind);
    OutputFile::ws(pOVar1,"}\n");
  }
  else {
    ppSVar3 = uniq_vector_t<const_re2c::State_*>::operator[](accepts,l);
    genGoTo(o,ind,s,*ppSVar3,readCh);
  }
  return;
}

Assistant:

void emit_accept_binary (OutputFile & o, uint32_t ind, bool & readCh, const State * const s, const accept_t & accepts, size_t l, size_t r)
{
	if (l < r)
	{
		const size_t m = (l + r) >> 1;
		o.wind(ind).ws("if (").wstring(opts->yyaccept).ws(r == l+1 ? " == " : " <= ").wu64(m).ws(") {\n");
		emit_accept_binary (o, ++ind, readCh, s, accepts, l, m);
		o.wind(--ind).ws("} else {\n");
		emit_accept_binary (o, ++ind, readCh, s, accepts, m + 1, r);
		o.wind(--ind).ws("}\n");
	}
	else
	{
		genGoTo(o, ind, s, accepts[l], readCh);
	}
}